

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktau.hpp
# Opt level: O2

double wdm::impl::ktau_stat_adjust
                 (vector<double,_std::allocator<double>_> *x,
                 vector<double,_std::allocator<double>_> *y,
                 vector<double,_std::allocator<double>_> *weights)

{
  double dVar1;
  double in_XMM1_Qa;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  allocator_type local_d9;
  double local_d8;
  undefined8 uStack_d0;
  double local_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  value_type_conflict local_38;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  utils::check_sizes(x,y,weights);
  utils::sort_all(x,y,weights);
  local_68 = utils::count_tied_pairs(x,weights);
  local_b8 = utils::count_tied_triplets(x,weights);
  local_80 = utils::count_ties_v(x,weights);
  utils::sort_all(y,x,weights);
  local_78 = utils::count_tied_pairs(y,weights);
  local_48 = utils::count_tied_triplets(y,weights);
  local_88 = utils::count_ties_v(y,weights);
  if ((weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_finish ==
      (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start) {
    local_38 = 1.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_30,
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3,&local_38,&local_d9);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(weights,&local_30);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  }
  local_d8 = utils::sum(weights);
  local_a8 = utils::perm_sum(weights,2);
  local_58 = utils::perm_sum(weights,3);
  utils::pow((utils *)&local_30,local_58,in_XMM1_Qa);
  local_c0 = utils::sum((vector<double,_std::allocator<double>_> *)&local_30);
  local_c0 = local_d8 / local_c0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  local_d8 = (local_d8 + local_d8) * (local_a8 + local_a8);
  local_90 = pow(local_c0,3.0);
  local_90 = local_90 * local_d8;
  dStack_b0 = local_b8 * 6.0;
  local_d8 = local_c0 * local_c0;
  uStack_d0 = 0;
  local_b8 = local_68 * 2.0;
  dVar1 = pow(local_c0,3.0);
  auVar2._0_8_ = local_78 * local_b8 * 2.0;
  auVar2._8_8_ = local_48 * dStack_b0 * 6.0;
  auVar3._8_8_ = local_58 * 54.0;
  auVar3._0_8_ = local_a8 * 4.0;
  auVar3 = divpd(auVar2,auVar3);
  local_b8 = local_d8 * auVar3._0_8_;
  dStack_b0 = dVar1 * auVar3._8_8_;
  dVar1 = pow(local_c0,3.0);
  dVar1 = ((local_a8 - local_78) * (local_a8 - local_68)) /
          (dStack_b0 + local_b8 + (local_90 - (local_80 - local_88) * dVar1) / 18.0);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  return local_d8 * dVar1;
}

Assistant:

inline double ktau_stat_adjust(
    std::vector<double> x,
    std::vector<double> y,
    std::vector<double> weights)
{
    utils::check_sizes(x, y, weights);

    // 1.1 Sort x, y, and weights in x order; break ties in according to y.
    utils::sort_all(x, y, weights);

    // 1.2 Count pairs and triplets of tied x and simultaneous ties in x and y.
    double pair_x = utils::count_tied_pairs(x, weights);
    double trip_x = utils::count_tied_triplets(x, weights);
    double v_x = utils::count_ties_v(x, weights);

    // 2.1 Sort y and weights in y order; break ties according to x.
    utils::sort_all(y, x, weights);

    // 2.2 Count pairs and triplets of tied y.
    double pair_y = utils::count_tied_pairs(y, weights);
    double trip_y = utils::count_tied_triplets(y, weights);
    double v_y = utils::count_ties_v(y, weights);

    // 3. Calculate adjustment factor.
    if (weights.size() == 0)
        weights = std::vector<double>(x.size(), 1.0);
    double s = utils::sum(weights);
    double s2 = utils::perm_sum(weights, 2);
    double s3 = utils::perm_sum(weights, 3);
    double r = s / utils::sum(utils::pow(weights, 2));
    double v_0 = 2 * s2 * (2 * s) * std::pow(r, 3);
    double v_1 = 2 * pair_x * 2 * pair_y / (2 * 2 * s2) * std::pow(r, 2);
    double v_2 = 6 * trip_x * 6 * trip_y / (9 * 6 * s3) * std::pow(r, 3);
    double v = (v_0 - std::pow(r, 3) * (v_x - v_y)) / 18 + (v_1 + v_2);
    return std::pow(r, 2) * std::sqrt((s2 - pair_x) * (s2 - pair_y) / v);
}